

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O1

Cba_Man_t *
Cba_ManAlloc(char *pFileName,int nNtks,Abc_Nam_t *pStrs,Abc_Nam_t *pFuns,Abc_Nam_t *pMods,
            Hash_IntMan_t *vHash)

{
  uint uVar1;
  uint uVar2;
  Cba_Man_t *pCVar3;
  char *pcVar4;
  size_t sVar5;
  Abc_Nam_t *p;
  Vec_Int_t *pVVar6;
  int *piVar7;
  void **ppvVar8;
  int iVar9;
  uint uVar10;
  
  pCVar3 = (Cba_Man_t *)calloc(1,0x658);
  pcVar4 = Extra_FileDesignName(pFileName);
  pCVar3->pName = pcVar4;
  if (pFileName == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pFileName);
    pcVar4 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar4,pFileName);
  }
  pCVar3->pSpec = pcVar4;
  if (pStrs == (Abc_Nam_t *)0x0) {
    pStrs = Abc_NamStart(1000,0x18);
  }
  pCVar3->pStrs = pStrs;
  p = pFuns;
  if (pFuns == (Abc_Nam_t *)0x0) {
    p = Abc_NamStart(100,0x18);
  }
  pCVar3->pFuns = p;
  if (pMods == (Abc_Nam_t *)0x0) {
    pMods = Abc_NamStart(100,0x18);
  }
  pCVar3->pMods = pMods;
  if (vHash == (Hash_IntMan_t *)0x0) {
    vHash = (Hash_IntMan_t *)calloc(1,0x18);
    uVar1 = 1099;
    while( true ) {
      do {
        uVar10 = uVar1;
        uVar1 = uVar10 + 1;
      } while ((uVar10 & 1) != 0);
      if (uVar1 < 9) break;
      iVar9 = 5;
      while( true ) {
        if (uVar1 % (iVar9 - 2U) == 0) break;
        uVar2 = iVar9 * iVar9;
        iVar9 = iVar9 + 2;
        if (uVar1 < uVar2) goto LAB_0034d459;
      }
    }
LAB_0034d459:
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    uVar2 = 0x10;
    if (0xe < uVar10) {
      uVar2 = uVar1;
    }
    pVVar6->nSize = 0;
    pVVar6->nCap = uVar2;
    piVar7 = (int *)malloc((long)(int)uVar2 << 2);
    pVVar6->pArray = piVar7;
    pVVar6->nSize = uVar1;
    memset(piVar7,0,(long)(int)uVar1 << 2);
    vHash->vTable = pVVar6;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 0x1130;
    pVVar6->nSize = 0;
    piVar7 = (int *)malloc(0x44c0);
    pVVar6->pArray = piVar7;
    vHash->vObjs = pVVar6;
    piVar7[0] = 0;
    piVar7[1] = 0;
    piVar7[2] = 0;
    piVar7[3] = 0;
    pVVar6->nSize = 4;
    vHash->nRefs = 1;
  }
  pCVar3->vHash = vHash;
  if (pFuns == (Abc_Nam_t *)0x0) {
    Abc_NamStrFindOrAdd(p,"1\'b0",(int *)0x0);
    Abc_NamStrFindOrAdd(p,"1\'b1",(int *)0x0);
    Abc_NamStrFindOrAdd(p,"1\'bx",(int *)0x0);
    Abc_NamStrFindOrAdd(p,"1\'bz",(int *)0x0);
  }
  if ((pCVar3->vNtks).nCap <= nNtks) {
    ppvVar8 = (pCVar3->vNtks).pArray;
    sVar5 = (long)(nNtks + 1) << 3;
    if (ppvVar8 == (void **)0x0) {
      ppvVar8 = (void **)malloc(sVar5);
    }
    else {
      ppvVar8 = (void **)realloc(ppvVar8,sVar5);
    }
    (pCVar3->vNtks).pArray = ppvVar8;
    (pCVar3->vNtks).nCap = nNtks + 1;
  }
  uVar1 = (pCVar3->vNtks).nSize;
  uVar10 = (pCVar3->vNtks).nCap;
  if (uVar1 == uVar10) {
    if ((int)uVar10 < 0x10) {
      ppvVar8 = (pCVar3->vNtks).pArray;
      if (ppvVar8 == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(ppvVar8,0x80);
      }
      (pCVar3->vNtks).pArray = ppvVar8;
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar10 * 2;
      if (iVar9 <= (int)uVar10) goto LAB_0034d5f5;
      ppvVar8 = (pCVar3->vNtks).pArray;
      if (ppvVar8 == (void **)0x0) {
        ppvVar8 = (void **)malloc((ulong)uVar10 << 4);
      }
      else {
        ppvVar8 = (void **)realloc(ppvVar8,(ulong)uVar10 << 4);
      }
      (pCVar3->vNtks).pArray = ppvVar8;
    }
    (pCVar3->vNtks).nCap = iVar9;
  }
LAB_0034d5f5:
  (pCVar3->vNtks).nSize = uVar1 + 1;
  (pCVar3->vNtks).pArray[(int)uVar1] = (void *)0x0;
  pCVar3->iRoot = 1;
  return pCVar3;
}

Assistant:

static inline Cba_Man_t * Cba_ManAlloc( char * pFileName, int nNtks, Abc_Nam_t * pStrs, Abc_Nam_t * pFuns, Abc_Nam_t * pMods, Hash_IntMan_t * vHash )
{
    Cba_Man_t * pNew = ABC_CALLOC( Cba_Man_t, 1 );
    pNew->pName = Extra_FileDesignName( pFileName );
    pNew->pSpec = Abc_UtilStrsav( pFileName );
    pNew->pStrs = pStrs ? pStrs : Abc_NamStart( 1000, 24 );
    pNew->pFuns = pFuns ? pFuns : Abc_NamStart( 100, 24 );
    pNew->pMods = pMods ? pMods : Abc_NamStart( 100, 24 );
    pNew->vHash = vHash ? vHash : Hash_IntManStart( 1000 );
    if ( pFuns == NULL )
    {
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'b0", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'b1", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'bx", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'bz", NULL);
    }
//    if ( vHash == NULL )
//        Hash_Int2ManInsert( pNew->vHash, 0, 0, 0 );
    Vec_PtrGrow( &pNew->vNtks,  nNtks+1 ); Vec_PtrPush( &pNew->vNtks, NULL );
    // set default root module
    pNew->iRoot = 1;
    return pNew;
}